

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::NotImplementedException::~NotImplementedException(NotImplementedException *this)

{
  NotImplementedException *in_RDI;
  
  ~NotImplementedException(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~NotImplementedException() CATCH_NOEXCEPT {}